

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall QGraphicsColorizeEffect::setColor(QGraphicsColorizeEffect *this,QColor *color)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  QColor QVar3;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  QVar3 = QPixmapColorizeFilter::color(*(QPixmapColorizeFilter **)(lVar1 + 0xa8));
  local_38._0_8_ = QVar3._0_8_;
  local_38._8_6_ = QVar3.ct._4_6_;
  cVar2 = QColor::operator==((QColor *)local_38,color);
  if (cVar2 == '\0') {
    QPixmapColorizeFilter::setColor(*(QPixmapColorizeFilter **)(lVar1 + 0xa8),color);
    lVar1 = *(long *)(*(long *)&(this->super_QGraphicsEffect).field_0x8 + 0x78);
    if (lVar1 != 0) {
      (**(code **)(**(long **)(lVar1 + 8) + 0x58))();
    }
    local_38._0_8_ = (void *)0x0;
    local_38._8_8_ = color;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsColorizeEffect::setColor(const QColor &color)
{
    Q_D(QGraphicsColorizeEffect);
    if (d->filter->color() == color)
        return;

    d->filter->setColor(color);
    update();
    emit colorChanged(color);
}